

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildRegisterDefaultCustomRects(ImFontAtlas *atlas)

{
  int iVar1;
  ImFontAtlas *atlas_local;
  
  if (atlas->CustomRectIds[0] < 0) {
    if ((atlas->Flags & 2U) == 0) {
      iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,0x80000000,0xb5,0x1b);
      atlas->CustomRectIds[0] = iVar1;
    }
    else {
      iVar1 = ImFontAtlas::AddCustomRectRegular(atlas,0x80000000,2,2);
      atlas->CustomRectIds[0] = iVar1;
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildRegisterDefaultCustomRects(ImFontAtlas* atlas)
{
    if (atlas->CustomRectIds[0] >= 0)
        return;
    if (!(atlas->Flags & ImFontAtlasFlags_NoMouseCursors))
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_ID, FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF*2+1, FONT_ATLAS_DEFAULT_TEX_DATA_H);
    else
        atlas->CustomRectIds[0] = atlas->AddCustomRectRegular(FONT_ATLAS_DEFAULT_TEX_DATA_ID, 2, 2);
}